

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiconengine.cpp
# Opt level: O1

void __thiscall QIconEngine::virtual_hook(QIconEngine *this,int id,void *data)

{
  QExplicitlySharedDataPointer<QPlatformPixmap> QVar1;
  ScaledPixmapArgument *arg;
  uint uVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  undefined1 auVar4 [16];
  double dVar5;
  double dVar7;
  undefined1 auVar6 [16];
  ulong local_58;
  QPixmap local_50;
  undefined1 local_38 [16];
  QExplicitlySharedDataPointer<QPlatformPixmap> local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (id == 4) {
    dVar5 = *(double *)((long)data + 0x10) * (double)(int)*data;
    dVar7 = *(double *)((long)data + 0x10) * (double)(int)((ulong)*data >> 0x20);
    auVar6._0_8_ = (double)((ulong)dVar5 & 0x8000000000000000 | 0x3fe0000000000000) + dVar5;
    auVar6._8_8_ = (double)((ulong)dVar7 & 0x8000000000000000 | 0x3fe0000000000000) + dVar7;
    auVar6 = minpd(_DAT_00684790,auVar6);
    auVar4._8_8_ = -(ulong)(-2147483648.0 < auVar6._8_8_);
    auVar4._0_8_ = -(ulong)(-2147483648.0 < auVar6._0_8_);
    uVar2 = movmskpd(4,auVar4);
    uVar3 = 0x8000000000000000;
    if ((uVar2 & 2) != 0) {
      uVar3 = (ulong)(uint)(int)auVar6._8_8_ << 0x20;
    }
    local_58 = 0x80000000;
    if ((uVar2 & 1) != 0) {
      local_58 = (ulong)(uint)(int)auVar6._0_8_;
    }
    local_58 = local_58 | uVar3;
    (*this->_vptr_QIconEngine[4])
              (&local_50,this,&local_58,(ulong)*(uint *)((long)data + 8),
               (ulong)*(uint *)((long)data + 0xc));
    local_28.d.ptr = (totally_ordered_wrapper<QPlatformPixmap_*>)&DAT_aaaaaaaaaaaaaaaa;
    local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QPaintDevice::QPaintDevice((QPaintDevice *)local_38);
    QVar1.d.ptr = local_50.data.d.ptr;
    local_38._0_8_ = &PTR__QPixmap_007e3618;
    local_50.data.d.ptr = (totally_ordered_wrapper<QPlatformPixmap_*>)(QPlatformPixmap *)0x0;
    local_28.d.ptr = *(totally_ordered_wrapper<QPlatformPixmap_*> *)((long)data + 0x28);
    ((totally_ordered_wrapper<QPlatformPixmap_*> *)((long)data + 0x28))->ptr =
         (QPlatformPixmap *)QVar1.d.ptr;
    QPixmap::~QPixmap((QPixmap *)local_38);
    QPixmap::~QPixmap(&local_50);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QIconEngine::virtual_hook(int id, void *data)
{
    switch (id) {
    case QIconEngine::ScaledPixmapHook: {
        QIconEngine::ScaledPixmapArgument &arg =
            *reinterpret_cast<QIconEngine::ScaledPixmapArgument*>(data);
        // try to get a pixmap with the correct size, the dpr is adjusted later on
        arg.pixmap = pixmap(arg.size * arg.scale, arg.mode, arg.state);
        break;
    }
    default:
        break;
    }
}